

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

Error __thiscall asmjit::BaseBuilder::runPasses(BaseBuilder *this)

{
  ErrorHandler *errorHandler;
  void *pvVar1;
  long *plVar2;
  undefined8 uVar3;
  Error err;
  Error EVar4;
  undefined8 message;
  ulong uVar5;
  long lVar6;
  PostponedErrorHandler postponed;
  ErrorHandler local_e0;
  anon_union_32_4_a21e1b61_for_String_0 local_d8;
  char local_b8 [136];
  
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    EVar4 = 5;
  }
  else if ((this->_passes).super_ZoneVectorBase._size == 0) {
    EVar4 = 0;
  }
  else {
    errorHandler = (this->super_BaseEmitter)._errorHandler;
    ErrorHandler::ErrorHandler(&local_e0);
    local_e0._vptr_ErrorHandler = (_func_int **)&PTR__PostponedErrorHandler_001544d8;
    local_d8._large.size = 0;
    local_d8._0_8_ = 0x20;
    local_d8._large.capacity = 0x87;
    local_d8._large.data = local_b8;
    local_b8[0] = '\0';
    BaseEmitter::setErrorHandler(&this->super_BaseEmitter,&local_e0);
    uVar5 = (ulong)(this->_passes).super_ZoneVectorBase._size;
    err = 0;
    if (uVar5 != 0) {
      pvVar1 = (this->_passes).super_ZoneVectorBase._data;
      lVar6 = 0;
      do {
        plVar2 = *(long **)((long)pvVar1 + lVar6);
        Zone::reset(&this->_passZone,0);
        err = (**(code **)(*plVar2 + 0x10))
                        (plVar2,&this->_passZone,(this->super_BaseEmitter)._logger);
        if (err != 0) goto LAB_00112d29;
        lVar6 = lVar6 + 8;
      } while (uVar5 << 3 != lVar6);
      err = 0;
    }
LAB_00112d29:
    EVar4 = 0;
    Zone::reset(&this->_passZone,0);
    BaseEmitter::setErrorHandler(&this->super_BaseEmitter,errorHandler);
    if (err != 0) {
      message = local_d8._small.data;
      uVar3 = local_d8._0_8_ & 0xff;
      if (0x1e < (local_d8._0_8_ & 0xff)) {
        message = local_d8._large.data;
        uVar3 = local_d8._large.size;
      }
      if (uVar3 == 0) {
        message = (char *)0x0;
      }
      EVar4 = BaseEmitter::reportError(&this->super_BaseEmitter,err,(char *)message);
    }
    local_e0._vptr_ErrorHandler = (_func_int **)&PTR__PostponedErrorHandler_001544d8;
    String::reset((String *)&local_d8._small);
    ErrorHandler::~ErrorHandler(&local_e0);
  }
  return EVar4;
}

Assistant:

Error BaseBuilder::runPasses() {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (_passes.empty())
    return kErrorOk;

  ErrorHandler* prev = errorHandler();
  PostponedErrorHandler postponed;

  Error err = kErrorOk;
  setErrorHandler(&postponed);

  for (Pass* pass : _passes) {
    _passZone.reset();
    err = pass->run(&_passZone, _logger);
    if (err)
      break;
  }
  _passZone.reset();
  setErrorHandler(prev);

  if (ASMJIT_UNLIKELY(err))
    return reportError(err, !postponed._message.empty() ? postponed._message.data() : nullptr);

  return kErrorOk;
}